

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O3

QAction * __thiscall QMenuBarPrivate::getNextAction(QMenuBarPrivate *this,int _start,int increment)

{
  undefined8 uVar1;
  undefined8 uVar2;
  QWidget *this_00;
  QRect *pQVar3;
  QAction *pQVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  QStyle *pQVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  
  do {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    updateGeometries(this);
    pQVar8 = QWidget::style(this_00);
    iVar6 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0xe,0,this_00,0);
    uVar7 = _start;
    if ((_start & increment) == 0xffffffff) {
      uVar7 = (uint)(this->super_QWidgetPrivate).actions.d.size;
    }
    if (increment == -1) {
      iVar9 = 0;
    }
    else {
      iVar9 = (int)(this->super_QWidgetPrivate).actions.d.size + -1;
    }
    iVar9 = uVar7 - iVar9;
    if (iVar9 != 0) {
      lVar10 = ((long)(int)uVar7 + (long)increment) * 8;
      do {
        pQVar3 = (this->actionRects).d.ptr;
        uVar1 = *(undefined8 *)((long)&(pQVar3->x1).m_i + lVar10 * 2);
        uVar2 = *(undefined8 *)((long)&(pQVar3->x2).m_i + lVar10 * 2);
        iVar13 = -(uint)((int)uVar2 == (int)uVar1 + -1);
        iVar14 = -(uint)((int)((ulong)uVar2 >> 0x20) == (int)((ulong)uVar1 >> 0x20) + -1);
        auVar12._4_4_ = iVar13;
        auVar12._0_4_ = iVar13;
        auVar12._8_4_ = iVar14;
        auVar12._12_4_ = iVar14;
        iVar13 = movmskpd((int)pQVar3,auVar12);
        if (iVar13 != 3) {
          pQVar4 = *(QAction **)((long)(this->super_QWidgetPrivate).actions.d.ptr + lVar10);
          if (iVar6 != 0) {
            return pQVar4;
          }
          cVar5 = QAction::isEnabled();
          if (cVar5 != '\0') {
            return pQVar4;
          }
        }
        lVar10 = lVar10 + (long)increment * 8;
        iVar9 = iVar9 + increment;
      } while (iVar9 != 0);
    }
    bVar11 = _start == 0xffffffff;
    _start = 0xffffffff;
    if (bVar11) {
      return (QAction *)0x0;
    }
  } while( true );
}

Assistant:

QAction *QMenuBarPrivate::getNextAction(const int _start, const int increment) const
{
    Q_Q(const QMenuBar);
    const_cast<QMenuBarPrivate*>(this)->updateGeometries();
    bool allowActiveAndDisabled = q->style()->styleHint(QStyle::SH_Menu_AllowActiveAndDisabled, nullptr, q);
    const int start = (_start == -1 && increment == -1) ? actions.size() : _start;
    const int end =  increment == -1 ? 0 : actions.size() - 1;

    for (int i = start; i != end;) {
        i += increment;
        QAction *current = actions.at(i);
        if (!actionRects.at(i).isNull() && (allowActiveAndDisabled || current->isEnabled()))
            return current;
    }

    if (_start != -1) //let's try from the beginning or the end
        return getNextAction(-1, increment);

    return nullptr;
}